

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O3

void __thiscall spvtools::anon_unknown_0::Disassembler::~Disassembler(Disassembler *this)

{
  NameMapper *pNVar1;
  pointer pSVar2;
  pointer puVar3;
  pointer pPVar4;
  spv_parsed_operand_t *psVar5;
  _Manager_type p_Var6;
  pointer pSVar7;
  pointer pPVar8;
  
  pSVar7 = (this->current_function_cfg_).blocks.
           super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->current_function_cfg_).blocks.
           super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar7 != pSVar2) {
    do {
      puVar3 = (pSVar7->successors).case_block_ids.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3,(long)(pSVar7->successors).case_block_ids.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar3);
      }
      pPVar8 = (pSVar7->instructions).
               super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar4 = (pSVar7->instructions).
               super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pPVar8 != pPVar4) {
        do {
          psVar5 = (pPVar8->operands_)._M_t.
                   super___uniq_ptr_impl<spv_parsed_operand_t,_std::default_delete<spv_parsed_operand_t[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spv_parsed_operand_t_*,_std::default_delete<spv_parsed_operand_t[]>_>
                   .super__Head_base<0UL,_spv_parsed_operand_t_*,_false>._M_head_impl;
          if (psVar5 != (spv_parsed_operand_t *)0x0) {
            operator_delete__(psVar5);
          }
          (pPVar8->operands_)._M_t.
          super___uniq_ptr_impl<spv_parsed_operand_t,_std::default_delete<spv_parsed_operand_t[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_spv_parsed_operand_t_*,_std::default_delete<spv_parsed_operand_t[]>_>
          .super__Head_base<0UL,_spv_parsed_operand_t_*,_false>._M_head_impl =
               (spv_parsed_operand_t *)0x0;
          pPVar8 = pPVar8 + 1;
        } while (pPVar8 != pPVar4);
        pPVar8 = (pSVar7->instructions).
                 super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      if (pPVar8 != (pointer)0x0) {
        operator_delete(pPVar8,(long)(pSVar7->instructions).
                                     super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pPVar8);
      }
      pSVar7 = pSVar7 + 1;
    } while (pSVar7 != pSVar2);
    pSVar7 = (this->current_function_cfg_).blocks.
             super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pSVar7 != (pointer)0x0) {
    operator_delete(pSVar7,(long)(this->current_function_cfg_).blocks.
                                 super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar7);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->instruction_disassembler_).id_comments_._M_h);
  p_Var6 = (this->instruction_disassembler_).name_mapper_.super__Function_base._M_manager;
  if (p_Var6 != (_Manager_type)0x0) {
    pNVar1 = &(this->instruction_disassembler_).name_mapper_;
    (*p_Var6)((_Any_data *)pNVar1,(_Any_data *)pNVar1,__destroy_functor);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->text_);
  std::ios_base::~ios_base((ios_base *)&this->field_0x88);
  return;
}

Assistant:

Disassembler(const AssemblyGrammar& grammar, uint32_t options,
               NameMapper name_mapper)
      : print_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_PRINT, options)),
        nested_indent_(
            spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_NESTED_INDENT, options)),
        reorder_blocks_(
            spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_REORDER_BLOCKS, options)),
        text_(),
        out_(print_ ? out_stream() : out_stream(text_)),
        instruction_disassembler_(grammar, out_.get(), options, name_mapper),
        header_(!spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_NO_HEADER, options)),
        byte_offset_(0) {}